

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

GraphicsPipelineDesc * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  Char *pCVar2;
  char (*in_RCX) [37];
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  CheckPipelineReady(this);
  bVar1 = PipelineStateDesc::IsAnyGraphicsPipeline
                    (&(this->
                      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      ).m_Desc);
  if (!bVar1) {
    FormatString<char[26],char[37]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_Desc.IsAnyGraphicsPipeline()",in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [37])0x20c;
    DebugAssertionFailed
              (pCVar2,"GetGraphicsPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x20c);
    std::__cxx11::string::~string((string *)local_30);
  }
  if ((this->field_6).m_pGraphicsPipelineData == (GraphicsPipelineData *)0x0) {
    FormatString<char[26],char[35]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pGraphicsPipelineData != nullptr",(char (*) [35])in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetGraphicsPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x20d);
    std::__cxx11::string::~string((string *)local_60);
  }
  return &((this->field_6).m_pGraphicsPipelineData)->Desc;
}

Assistant:

GetGraphicsPipelineDesc() const override final
    {
        CheckPipelineReady();
        VERIFY_EXPR(this->m_Desc.IsAnyGraphicsPipeline());
        VERIFY_EXPR(m_pGraphicsPipelineData != nullptr);
        return m_pGraphicsPipelineData->Desc;
    }